

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O2

bool __thiscall Clasp::WeightConstraint::integrateRoot(WeightConstraint *this,Solver *s)

{
  WL WVar1;
  uint uVar2;
  WL *pWVar3;
  pointer puVar4;
  pointer pLVar5;
  uint32 uVar6;
  GenericWatch *pGVar7;
  uint uVar8;
  int iVar9;
  uint32 i;
  uint uVar10;
  
  uVar10 = (s->levels_).super_type.ebo_.size;
  if (((uVar10 != 0) && (uVar6 = highestUndoLevel(this,s), uVar6 < (s->levels_).root)) &&
     ((s->conflict_).ebo_.size == 0)) {
    pWVar3 = this->lits_;
    WVar1 = *pWVar3;
    puVar4 = (s->assign_).assign_.ebo_.buf;
    iVar9 = 0;
    for (uVar8 = 0; ((uint)WVar1 & 0x3fffffff) != uVar8; uVar8 = uVar8 + 1) {
      uVar2 = *(uint *)((long)puVar4 +
                       (ulong)((uint)pWVar3[(ulong)(uVar8 << (SUB41(*pWVar3,3) >> 7)) + 1] &
                              0xfffffffc));
      if (0xf < uVar2 && (uVar2 & 3) != 0) {
        iVar9 = iVar9 + 1;
        puVar4[(uint)pWVar3[(ulong)(uVar8 << (SUB41(*pWVar3,3) >> 7)) + 1] >> 2] = uVar2 | 0xc;
        if (uVar2 >> 4 < uVar10) {
          uVar10 = uVar2 >> 4;
        }
      }
    }
    uVar6 = (s->assign_).front;
    uVar10 = *(uint *)((s->levels_).super_type.ebo_.buf + (uVar10 - 1)) & 0x3fffffff;
    while ((uVar6 != uVar10 && (iVar9 != 0))) {
      pLVar5 = (s->assign_).trail.ebo_.buf;
      puVar4 = (s->assign_).assign_.ebo_.buf;
      uVar8 = pLVar5[uVar10].rep_;
      uVar2 = *(uint *)((long)puVar4 + (ulong)(uVar8 & 0xfffffffc));
      if (((uVar8 & 2) * 2 + 4 & uVar2) != 0) {
        iVar9 = iVar9 + -1;
        puVar4[uVar8 >> 2] = uVar2 & 0xfffffff3;
        if (((s->conflict_).ebo_.size == 0) &&
           (pGVar7 = Solver::getWatch(s,(Literal)pLVar5[uVar10].rep_,&this->super_Constraint),
           pGVar7 != (GenericWatch *)0x0)) {
          (**pGVar7->con->_vptr_Constraint)(pGVar7->con,s,(ulong)uVar8,&pGVar7->data);
        }
      }
      uVar10 = uVar10 + 1;
    }
    pLVar5 = (s->assign_).trail.ebo_.buf;
    puVar4 = (s->assign_).assign_.ebo_.buf;
    while ((uVar6 != (s->assign_).trail.ebo_.size && (iVar9 != 0))) {
      uVar10 = pLVar5[uVar6].rep_;
      uVar8 = *(uint *)((long)puVar4 + (ulong)(uVar10 & 0xfffffffc));
      if ((uVar8 & 0xc) != 0) {
        iVar9 = iVar9 + -1;
        puVar4[uVar10 >> 2] = uVar8 & 0xfffffff3;
      }
      uVar6 = uVar6 + 1;
    }
  }
  return (s->conflict_).ebo_.size == 0;
}

Assistant:

bool WeightConstraint::integrateRoot(Solver& s) {
	if (!s.decisionLevel() || highestUndoLevel(s) >= s.rootLevel() || s.hasConflict()) { return !s.hasConflict(); }
	// check if constraint has assigned literals
	uint32 low = s.decisionLevel(), vDL;
	uint32 np  = 0;
	for (uint32 i = 0, end = size(); i != end; ++i) {
		Var v = lits_->var(i);
		if (s.value(v) != value_free && (vDL = s.level(v)) != 0) {
			++np;
			s.markSeen(v);
			low = std::min(low, vDL);
		}
	}
	// propagate assigned literals in assignment order
	const LitVec& trail = s.trail();
	const uint32  end   = sizeVec(trail) - s.queueSize();
	GenericWatch* w     = 0;
	for (uint32 i = s.levelStart(low); i != end && np; ++i) {
		Literal p = trail[i];
		if (s.seen(p) && np--) {
			s.clearSeen(p.var());
			if (!s.hasConflict() && (w = s.getWatch(trail[i], this)) != 0) {
				w->propagate(s, p);
			}
		}
	}
	for (uint32 i = end; i != trail.size() && np; ++i) {
		if (s.seen(trail[i].var())) { --np; s.clearSeen(trail[i].var()); }
	}
	return !s.hasConflict();
}